

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

void Aig_ManDfsAll_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  
  if (pObj->TravId == p->nTravIds) {
    return;
  }
  pObj->TravId = p->nTravIds;
  uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar4 = uVar2 & 7;
  if (uVar4 == 3) {
    pAVar5 = pObj->pFanin0;
  }
  else {
    if (uVar4 == 2) goto LAB_0062adcd;
    if ((uVar2 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                    ,0xc5,"void Aig_ManDfsAll_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Aig_ManDfsAll_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
    pAVar5 = pObj->pFanin1;
  }
  Aig_ManDfsAll_rec(p,(Aig_Obj_t *)((ulong)pAVar5 & 0xfffffffffffffffe),vNodes);
LAB_0062adcd:
  uVar2 = vNodes->nSize;
  if (uVar2 == vNodes->nCap) {
    if ((int)uVar2 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = 0x10;
    }
    else {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
      }
      vNodes->pArray = ppvVar3;
      vNodes->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar3 = vNodes->pArray;
  }
  iVar1 = vNodes->nSize;
  vNodes->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pObj;
  return;
}

Assistant:

void Aig_ManDfsAll_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}